

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modes.c
# Opt level: O1

int set_default_mode(int f,int n)

{
  ulong uVar1;
  char *pcVar2;
  maps_s *pmVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  int local_48;
  short sStack_44;
  undefined2 uStack_42;
  char modebuf [32];
  
  iVar8 = 0;
  pcVar2 = eread("Set Default Mode: ",(char *)&local_48,0x20,8);
  if (pcVar2 == (char *)0x0) {
    iVar8 = 2;
  }
  else if (*pcVar2 != '\0') {
    pmVar3 = name_mode((char *)&local_48);
    if (pmVar3 == (maps_s *)0x0) {
      dobeep();
      iVar8 = 0;
      ewprintf("can\'t find mode %s",&local_48);
    }
    else {
      if (((f & 7U) == 0) && (-1 < defb_nmodes)) {
        lVar4 = 0;
        do {
          if (*(maps_s **)((long)defb_modes + lVar4) == pmVar3) {
            n = 0;
            break;
          }
          lVar4 = lVar4 + 8;
        } while ((ulong)(uint)defb_nmodes * 8 + 8 != lVar4);
      }
      uVar5 = (ulong)(uint)defb_nmodes;
      lVar4 = (long)defb_nmodes;
      if (n < 1) {
        bVar9 = defb_nmodes < 1;
        if (defb_nmodes < 1) {
          return 1;
        }
        if (pmVar3 == defb_modes[1]) {
          lVar6 = 1;
        }
        else {
          uVar1 = 0;
          do {
            uVar7 = uVar1;
            if (uVar5 - 1 == uVar7) {
              return 1;
            }
            uVar1 = uVar7 + 1;
          } while (pmVar3 != defb_modes[uVar7 + 2]);
          bVar9 = uVar5 <= uVar7 + 1;
          lVar6 = uVar7 + 2;
        }
        if (bVar9) {
          return 1;
        }
        if ((int)lVar6 < defb_nmodes) {
          do {
            defb_modes[lVar6] = defb_modes[lVar6 + 1];
            lVar6 = lVar6 + 1;
          } while (lVar4 != lVar6);
        }
        defb_nmodes = defb_nmodes + -1;
      }
      else {
        if (-1 < defb_nmodes) {
          lVar6 = 0;
          do {
            if (*(maps_s **)((long)defb_modes + lVar6) == pmVar3) {
              return 1;
            }
            lVar6 = lVar6 + 8;
          } while (uVar5 * 8 + 8 != lVar6);
        }
        if (2 < defb_nmodes) {
          dobeep();
          ewprintf("Too many modes");
          return 0;
        }
        defb_nmodes = defb_nmodes + 1;
        defb_modes[lVar4 + 1] = pmVar3;
      }
      if (modebuf._0_2_ == 0x65 &&
          CONCAT26(uStack_42,CONCAT24(sStack_44,local_48)) == 0x746972777265766f) {
        defb_flag = (defb_flag & 0xfffffff7U) + (uint)(0 < n) * 8;
      }
      iVar8 = 1;
      if (sStack_44 == 0x62 && local_48 == 0x61746f6e) {
        if (n < 1) {
          defb_flag = defb_flag & 0xfffffffb;
        }
        else {
          defb_flag = defb_flag | 4;
        }
      }
    }
  }
  return iVar8;
}

Assistant:

int
set_default_mode(int f, int n)
{
	int	 i;
	struct maps_s	*m;
	char	 modebuf[32], *bufp;

	if ((bufp = eread("Set Default Mode: ", modebuf, sizeof(modebuf),
	    EFNEW)) == NULL)
		return (ABORT);
	else if (bufp[0] == '\0')
		return (FALSE);
	if ((m = name_mode(modebuf)) == NULL) {
		dobeep();
		ewprintf("can't find mode %s", modebuf);
		return (FALSE);
	}
	if (!(f & FFARG)) {
		for (i = 0; i <= defb_nmodes; i++)
			if (defb_modes[i] == m) {
				/* mode already set */
				n = 0;
				break;
			}
	}
	if (n > 0) {
		for (i = 0; i <= defb_nmodes; i++)
			if (defb_modes[i] == m)
				/* mode already set */
				return (TRUE);
		if (defb_nmodes >= PBMODES - 1) {
			dobeep();
			ewprintf("Too many modes");
			return (FALSE);
		}
		defb_modes[++defb_nmodes] = m;
	} else {
		/* fundamental is defb_modes[0] and can't be unset */
		for (i = 1; i <= defb_nmodes && m != defb_modes[i]; i++);
		if (i > defb_nmodes)
			/* mode was not set */
			return (TRUE);
		for (; i < defb_nmodes; i++)
			defb_modes[i] = defb_modes[i + 1];
		defb_nmodes--;
	}
	if (strcmp(modebuf, "overwrite") == 0) {
		if (n <= 0)
			defb_flag &= ~BFOVERWRITE;
		else
			defb_flag |= BFOVERWRITE;
	}
	if (strcmp(modebuf, "notab") == 0) {
		if (n <= 0)
			defb_flag &= ~BFNOTAB;
		else
			defb_flag |= BFNOTAB;
	}
	return (TRUE);
}